

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackFrame.SystemV.cpp
# Opt level: O1

bool __thiscall Js::Amd64StackFrame::SkipToFrame(Amd64StackFrame *this,void *frameAddress)

{
  void **ppvVar1;
  
  this->frame = (void **)frameAddress;
  this->addressOfCodeAddr = (void *)((long)frameAddress + 8);
  this->codeAddr = *(void **)((long)frameAddress + 8);
  ppvVar1 = *frameAddress;
  this->frame = ppvVar1;
  return ppvVar1 != (void **)0x0;
}

Assistant:

bool
Amd64StackFrame::SkipToFrame(void * frameAddress)
{
    this->frame = (void **)frameAddress;
    return Next();
}